

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_avx::forward(Cast_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _c;
  int _elempack;
  int *piVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_short uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  _func_int *p_Var12;
  size_t sVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  void *pvVar16;
  ulong uVar17;
  long lVar18;
  int i;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  undefined1 (*pauVar22) [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  p_Var12 = this->_vptr_Cast_x86_avx[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var12) == *(int *)(&this->field_0xd4 + (long)p_Var12)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar9 = bottom_blob->w;
    iVar10 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar9;
    top_blob->h = iVar10;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar9 = bottom_blob->w;
  iVar10 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar8 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar13 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var12)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var12) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx + (long)p_Var12),bottom_blob,top_blob,
                    opt);
    }
    sVar13 = sVar13 * 4;
    break;
  case 2:
  case 4:
    sVar13 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar13 = bottom_blob->elemsize;
  }
  switch(iVar8) {
  case 1:
    Mat::create(top_blob,iVar9,sVar13,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar9,iVar10,sVar13,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar9,iVar10,_c,sVar13,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar9,iVar10,iVar1,_c,sVar13,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 1) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 2)) {
    iVar8 = cpu_support_x86_f16c();
    if (iVar8 == 0) {
      iVar8 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar14 = 0;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      uVar17 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar17 = uVar14;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        sVar13 = bottom_blob->cstep;
        sVar4 = top_blob->cstep;
        sVar5 = bottom_blob->elemsize;
        pvVar11 = bottom_blob->data;
        sVar6 = top_blob->elemsize;
        pvVar16 = top_blob->data;
        for (lVar18 = 0; iVar8 != (int)lVar18; lVar18 = lVar18 + 1) {
          uVar7 = float32_to_float16(*(float *)((long)pvVar11 + lVar18 * 4 + sVar13 * sVar5 * uVar14
                                               ));
          *(unsigned_short *)((long)pvVar16 + lVar18 * 2 + sVar4 * sVar6 * uVar14) = uVar7;
        }
      }
    }
    else {
      cast_fp32_to_fp16_sse_f16c(bottom_blob,top_blob,opt);
    }
  }
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 2) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1)) {
    iVar8 = cpu_support_x86_f16c();
    if (iVar8 == 0) {
      iVar8 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar14 = 0;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      uVar17 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar17 = uVar14;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        sVar13 = bottom_blob->cstep;
        sVar4 = top_blob->cstep;
        sVar5 = bottom_blob->elemsize;
        pvVar11 = bottom_blob->data;
        sVar6 = top_blob->elemsize;
        pvVar16 = top_blob->data;
        for (lVar18 = 0; iVar8 != (int)lVar18; lVar18 = lVar18 + 1) {
          fVar23 = float16_to_float32(*(unsigned_short *)
                                       ((long)pvVar11 + lVar18 * 2 + sVar13 * sVar5 * uVar14));
          *(float *)((long)pvVar16 + lVar18 * 4 + sVar4 * sVar6 * uVar14) = fVar23;
        }
      }
    }
    else {
      cast_fp16_to_fp32_sse_f16c(bottom_blob,top_blob,opt);
    }
  }
  pp_Var3 = this->_vptr_Cast_x86_avx;
  p_Var12 = pp_Var3[-3];
  iVar8 = *(int *)(&this->field_0xd0 + (long)p_Var12);
  if (iVar8 == 3) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var12) != 1) goto LAB_0044977e;
    uVar21 = iVar1 * _elempack * iVar10 * iVar9;
    pvVar11 = bottom_blob->data;
    sVar13 = bottom_blob->cstep;
    pvVar16 = top_blob->data;
    sVar4 = top_blob->cstep;
    sVar5 = top_blob->elemsize;
    uVar17 = 0;
    uVar14 = (ulong)uVar21;
    if ((int)uVar21 < 1) {
      uVar14 = uVar17;
    }
    uVar20 = (ulong)_c;
    if ((int)_c < 1) {
      uVar20 = uVar17;
    }
    sVar6 = bottom_blob->elemsize;
    for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
      for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
        *(float *)((long)pvVar16 + uVar19 * 4) = (float)(int)*(char *)((long)pvVar11 + uVar19);
      }
      pvVar16 = (void *)((long)pvVar16 + sVar4 * sVar5);
      pvVar11 = (void *)((long)pvVar11 + sVar13 * sVar6);
    }
    p_Var12 = pp_Var3[-3];
    iVar8 = *(int *)(&this->field_0xd0 + (long)p_Var12);
  }
  if ((iVar8 == 1) && (*(int *)(&this->field_0xd4 + (long)p_Var12) == 4)) {
    iVar9 = cpu_support_x86_avx2();
    if (iVar9 == 0) {
      iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar17 = 0;
      uVar14 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar14 = uVar17;
      }
      for (; uVar17 != uVar14; uVar17 = uVar17 + 1) {
        pvVar11 = bottom_blob->data;
        sVar13 = bottom_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        pauVar22 = (undefined1 (*) [16])(sVar4 * uVar17 * sVar13 + (long)pvVar11);
        pvVar16 = top_blob->data;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pauVar15 = (undefined1 (*) [16])(sVar6 * uVar17 * sVar5 + (long)pvVar16);
        lVar18 = 0;
        for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
          auVar24 = vpsrld_avx(*pauVar22,0x10);
          auVar25 = vpsrld_avx(pauVar22[1],0x10);
          auVar24 = vpackusdw_avx(auVar24,auVar25);
          auVar25 = vpsrld_avx(pauVar22[2],0x10);
          auVar26 = vpsrld_avx(pauVar22[3],0x10);
          auVar25 = vpackusdw_avx(auVar25,auVar26);
          pauVar15[1] = auVar25;
          *pauVar15 = auVar24;
          pauVar22 = pauVar22 + 4;
          pauVar15 = pauVar15 + 2;
          lVar18 = lVar18 + 0x10;
        }
        for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
          auVar24 = vpsrld_avx(*pauVar22,0x10);
          auVar25 = vpsrld_avx(pauVar22[1],0x10);
          auVar24 = vpackusdw_avx(auVar24,auVar25);
          *pauVar15 = auVar24;
          pauVar22 = pauVar22 + 2;
          pauVar15 = pauVar15 + 1;
          lVar18 = lVar18 + 8;
        }
        for (; (int)lVar18 < iVar9; lVar18 = lVar18 + 1) {
          *(undefined2 *)((long)pvVar16 + lVar18 * 2 + sVar6 * sVar5 * uVar17) =
               *(undefined2 *)((long)pvVar11 + lVar18 * 4 + sVar4 * sVar13 * uVar17 + 2);
        }
      }
    }
    else {
      cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
    }
  }
LAB_0044977e:
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 4) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1)) {
    iVar9 = cpu_support_x86_avx2();
    if (iVar9 == 0) {
      iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar14 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar14 = 0;
      }
      for (uVar17 = 0; uVar17 != uVar14; uVar17 = uVar17 + 1) {
        pvVar11 = bottom_blob->data;
        sVar13 = bottom_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        pauVar22 = (undefined1 (*) [16])(sVar4 * uVar17 * sVar13 + (long)pvVar11);
        pvVar16 = top_blob->data;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pauVar15 = (undefined1 (*) [16])(sVar6 * uVar17 * sVar5 + (long)pvVar16);
        lVar18 = 0;
        for (iVar10 = 0; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
          auVar25 = vpunpcklwd_avx((undefined1  [16])0x0,*pauVar22);
          auVar24 = vpunpckhwd_avx((undefined1  [16])0x0,*pauVar22);
          pauVar15[1] = auVar24;
          *pauVar15 = auVar25;
          pauVar22 = pauVar22 + 1;
          pauVar15 = pauVar15 + 2;
          lVar18 = lVar18 + 8;
        }
        for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)*pauVar22;
          auVar24 = vpunpcklwd_avx((undefined1  [16])0x0,auVar24);
          *pauVar15 = auVar24;
          pauVar22 = (undefined1 (*) [16])(*pauVar22 + 8);
          pauVar15 = pauVar15 + 1;
          lVar18 = lVar18 + 4;
        }
        for (; (int)lVar18 < iVar9; lVar18 = lVar18 + 1) {
          *(uint *)((long)pvVar16 + lVar18 * 4 + sVar6 * sVar5 * uVar17) =
               (uint)*(ushort *)((long)pvVar11 + lVar18 * 2 + sVar4 * sVar13 * uVar17) << 0x10;
        }
      }
    }
    else {
      cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
    }
  }
  return 0;
}

Assistant:

int Cast_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}